

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

void __thiscall kratos::IfStmt::set_then(IfStmt *this,shared_ptr<kratos::ScopedStmtBlock> *stmt)

{
  element_type *peVar1;
  pointer psVar2;
  shared_ptr<kratos::Stmt> *s;
  pointer stmt_00;
  
  peVar1 = (this->then_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((stmt->super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      peVar1) {
    (*(peVar1->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xc])();
    peVar1 = (stmt->super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar2 = (peVar1->super_StmtBlock).stmts_.
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (stmt_00 = (peVar1->super_StmtBlock).stmts_.
                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; stmt_00 != psVar2;
        stmt_00 = stmt_00 + 1) {
      StmtBlock::add_stmt(&((this->then_body_).
                            super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_StmtBlock,stmt_00);
    }
  }
  return;
}

Assistant:

void IfStmt::set_then(const std::shared_ptr<ScopedStmtBlock> &stmt) {
    if (stmt != then_body_) {
        then_body_->clear();
        for (auto &s : *stmt) {
            then_body_->add_stmt(s);
        }
    }
}